

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntervalMap.h
# Opt level: O2

void __thiscall
slang::IntervalMapDetails::NodeBase<slang::IntervalMapDetails::interval<int>,_int,_16U>::
transferToRightSib(NodeBase<slang::IntervalMapDetails::interval<int>,_int,_16U> *this,uint32_t size,
                  NodeBase<slang::IntervalMapDetails::interval<int>,_int,_16U> *sib,uint32_t sibSize
                  ,uint32_t count)

{
  moveRight(sib,0,count,sibSize);
  NodeBase<slang::IntervalMapDetails::interval<int>,int,16u>::copy<16u>
            ((NodeBase<slang::IntervalMapDetails::interval<int>,int,16u> *)sib,this,size - count,0,
             count);
  return;
}

Assistant:

void transferToRightSib(uint32_t size, NodeBase& sib, uint32_t sibSize, uint32_t count) {
        sib.moveRight(0, count, sibSize);
        sib.copy(*this, size - count, 0, count);
    }